

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlnNdr.c
# Opt level: O2

void * Wln_NtkToNdr(Wln_Ntk_t *p)

{
  int *piVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  Ndr_Data_t *p_00;
  uchar *puVar5;
  uint *puVar6;
  Vec_Int_t *p_01;
  int *pOutputs;
  int iVar7;
  long lVar8;
  int *in_stack_ffffffffffffff88;
  char *pcVar9;
  int local_54;
  Ndr_Data_t *local_50;
  int local_48;
  int local_44;
  Vec_Int_t *local_40;
  ulong local_38;
  
  p_00 = (Ndr_Data_t *)malloc(0x18);
  p_00->nCap = 0x10;
  puVar5 = (uchar *)malloc(0x10);
  p_00->pHead = puVar5;
  puVar6 = (uint *)malloc(0x100);
  p_00->pBody = puVar6;
  *puVar5 = '\x01';
  *puVar6 = 0;
  puVar5[1] = '\a';
  p_00->nSize = 2;
  puVar6[1] = 1;
  iVar7 = 0;
  Ndr_DataAddTo(p_00,0,2);
  Ndr_DataResize(p_00,6);
  puVar5 = p_00->pHead;
  iVar2 = p_00->nSize;
  puVar5[iVar2] = '\x02';
  puVar6 = p_00->pBody;
  puVar6[iVar2] = 0;
  puVar5[(long)iVar2 + 1] = '\a';
  p_00->nSize = iVar2 + 2U;
  puVar6[(long)iVar2 + 1] = 1;
  Ndr_DataAddTo(p_00,2,iVar2);
  local_50 = p_00;
  Ndr_DataAddTo(p_00,0,iVar2);
  if (*puVar6 == iVar2 + 2U) {
    for (; iVar7 < (p->vCis).nSize - (p->vFfs).nSize; iVar7 = iVar7 + 1) {
      iVar2 = Vec_IntEntry(&p->vCis,iVar7);
      local_54 = iVar2;
      iVar3 = Wln_ObjRangeEnd(p,iVar2);
      iVar4 = Wln_ObjRangeBeg(p,iVar2);
      pcVar9 = (char *)0x3191bb;
      iVar2 = Wln_ObjIsSigned(p,iVar2);
      in_stack_ffffffffffffff88 = (int *)0x0;
      Ndr_AddObject(local_50,0x102,3,iVar3,iVar4,iVar2,0,0,(int *)0x1,(int)&local_54,(int *)0x0,
                    pcVar9);
    }
    p_01 = Vec_IntAlloc(10);
    local_40 = &p->vTypes;
    lVar8 = 1;
    while( true ) {
      iVar2 = (int)lVar8;
      local_54 = iVar2;
      if ((p->vTypes).nSize <= lVar8) break;
      iVar7 = Wln_ObjIsCio(p,iVar2);
      if (iVar7 == 0) {
        p_01->nSize = 0;
        for (iVar7 = 0; iVar7 < p->vFanins[lVar8].nSize; iVar7 = iVar7 + 1) {
          iVar3 = Wln_ObjFanin(p,iVar2,iVar7);
          if (iVar3 != 0) {
            Vec_IntPush(p_01,iVar3);
          }
        }
        local_44 = Vec_IntEntry(local_40,iVar2);
        local_48 = Wln_ObjRangeEnd(p,iVar2);
        iVar7 = Wln_ObjRangeBeg(p,iVar2);
        iVar3 = Wln_ObjIsSigned(p,iVar2);
        local_38 = (ulong)(uint)p_01->nSize;
        piVar1 = p_01->pArray;
        pcVar9 = (char *)0x3192b8;
        iVar4 = Wln_ObjIsConst(p,iVar2);
        if (iVar4 == 0) {
          pOutputs = (int *)0x0;
        }
        else {
          pcVar9 = (char *)0x3192c7;
          pOutputs = (int *)Wln_ObjConstString(p,iVar2);
        }
        in_stack_ffffffffffffff88 = (int *)0x0;
        Ndr_AddObject(local_50,0x102,local_44,local_48,iVar7,iVar3,(int)local_38,(int)piVar1,
                      (int *)0x1,(int)&local_54,pOutputs,pcVar9);
      }
      lVar8 = lVar8 + 1;
    }
    Vec_IntFree(p_01);
    for (iVar2 = 0; iVar2 < (p->vCos).nSize - (p->vFfs).nSize; iVar2 = iVar2 + 1) {
      iVar7 = Vec_IntEntry(&p->vCos,iVar2);
      local_54 = iVar7;
      iVar3 = Wln_ObjRangeEnd(p,iVar7);
      iVar4 = Wln_ObjRangeBeg(p,iVar7);
      pcVar9 = (char *)0x319356;
      iVar7 = Wln_ObjIsSigned(p,iVar7);
      in_stack_ffffffffffffff88 = (int *)((ulong)in_stack_ffffffffffffff88 & 0xffffffff00000000);
      Ndr_AddObject(local_50,0x102,4,iVar3,iVar4,iVar7,1,(int)&local_54,in_stack_ffffffffffffff88,0,
                    (int *)0x0,pcVar9);
    }
    return local_50;
  }
  __assert_fail("(int)p->pBody[0] == p->nSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/miniaig/ndr.h"
                ,0x21c,"int Ndr_AddModule(void *, int)");
}

Assistant:

ABC_NAMESPACE_IMPL_START

////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////

////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////

/**Function*************************************************************

  Synopsis    []

  Description []
               
  SideEffects []

  SeeAlso     []

***********************************************************************/
void * Wln_NtkToNdr( Wln_Ntk_t * p )
{
    Vec_Int_t * vFanins;
    int i, k, iObj, iFanin;
    // create a new module
    void * pDesign = Ndr_Create( 1 );
    int ModId = Ndr_AddModule( pDesign, 1 );
    // add primary inputs
    Wln_NtkForEachPi( p, iObj, i ) 
    {
        Ndr_AddObject( pDesign, ModId, ABC_OPER_CI, 0,   
            Wln_ObjRangeEnd(p, iObj), Wln_ObjRangeBeg(p, iObj), Wln_ObjIsSigned(p, iObj),   
            0, NULL,  1, &iObj,  NULL  ); // no fanins
    }
    // add internal nodes 
    vFanins = Vec_IntAlloc( 10 );
    Wln_NtkForEachObjInternal( p, iObj ) 
    {
        Vec_IntClear( vFanins );
        Wln_ObjForEachFanin( p, iObj, iFanin, k )
            Vec_IntPush( vFanins, iFanin );
        Ndr_AddObject( pDesign, ModId, Wln_ObjType(p, iObj), 0,   
            Wln_ObjRangeEnd(p, iObj), Wln_ObjRangeBeg(p, iObj), Wln_ObjIsSigned(p, iObj),   
            Vec_IntSize(vFanins), Vec_IntArray(vFanins), 1, &iObj,  
            Wln_ObjIsConst(p, iObj) ? Wln_ObjConstString(p, iObj) : NULL ); 
    }
    Vec_IntFree( vFanins );
    // add primary outputs
    Wln_NtkForEachPo( p, iObj, i ) 
    {
        Ndr_AddObject( pDesign, ModId, ABC_OPER_CO, 0,                   
            Wln_ObjRangeEnd(p, iObj), Wln_ObjRangeBeg(p, iObj), Wln_ObjIsSigned(p, iObj),   
            1, &iObj,  0, NULL,  NULL ); 
    }
    return pDesign;
}